

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::init
          (FeedbackRecordVariableSelectionCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  ShaderProgram *this_00;
  long *plVar4;
  bool bVar5;
  ContextType ctxType;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer __dest;
  NotSupportedError *this_01;
  TestError *this_02;
  long lVar8;
  ios_base *this_03;
  size_type __dnew_3;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  string source;
  size_type __dnew_4;
  string local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  ShaderProgram *local_2a0;
  long *local_298;
  long local_290;
  long local_288 [2];
  uint local_278;
  value_type local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  deUint32 local_108;
  undefined1 local_100 [208];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar5) {
    bVar5 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (bVar5) {
      bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
      ;
      if (bVar5) goto LAB_0159dda2;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0159dda2:
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Declaring multiple output variables with the same name in multiple shader stages. Capturing the value of the varying using transform feedback."
             ,0x8e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  this_03 = local_138;
  std::ios_base::~ios_base(this_03);
  if (Functional::(anonymous_namespace)::FeedbackRecordVariableSelectionCase::init()::initialData ==
      '\0') {
    _GLOBAL__N_1::FeedbackRecordVariableSelectionCase::init((EVP_PKEY_CTX *)this_03);
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Creating buffer for transform feedback. Allocating storage for one triangle. Filling with -1.0"
             ,0x5e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_xfbBuf);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_xfbBuf);
  (**(code **)(lVar8 + 0x150))(0x8c8e,0x30,init::initialData,0x88e9);
  err = (**(code **)(lVar8 + 0x800))();
  glu::checkError(err,"gen xfb buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb2f);
  local_2a0 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_318._0_8_ = (pointer)0x9a;
  local_2c8._0_8_ = &local_2b8;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_2c8,(ulong)local_318);
  uVar3 = local_318._0_8_;
  local_2b8._M_allocated_capacity = local_318._0_8_;
  local_2c8._0_8_ = paVar7;
  memcpy(paVar7,
         "${VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 tf_feedback;\nvoid main()\n{\n\tgl_Position = a_position;\n\ttf_feedback = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
         ,0x9a);
  local_2c8._8_8_ = uVar3;
  paVar7->_M_local_buf[uVar3] = '\0';
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_318._0_4_ = iVar6;
  specializeShader(&local_1d0,(string *)local_2c8,(ContextType *)local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._0_8_ != &local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  local_278 = 0;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (ulong)local_278 * 0x18),&local_270);
  local_340._0_8_ = (pointer)0x6e;
  local_318._0_8_ = &local_308;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_318,(ulong)local_340);
  uVar3 = local_340._0_8_;
  local_308._M_allocated_capacity = local_340._0_8_;
  local_318._0_8_ = paVar7;
  memcpy(paVar7,
         "${VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
         ,0x6e);
  local_318._8_8_ = uVar3;
  paVar7->_M_local_buf[uVar3] = '\0';
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_340._0_4_ = iVar6;
  specializeShader(&local_1f0,(string *)local_318,(ContextType *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
  }
  local_2c8._0_4_ = 1;
  local_2c8._8_8_ = local_2b8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2c8 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_2c8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2c8 + 8));
  local_2f0._0_8_ = (pointer)0x116;
  local_340._0_8_ = &local_330;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_340,(ulong)local_2f0);
  uVar3 = local_2f0._0_8_;
  local_330._M_allocated_capacity = local_2f0._0_8_;
  local_340._0_8_ = paVar7;
  memcpy(paVar7,
         "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices=3) out;\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tgl_TessLevelOuter[0] = 1.0;\n\tgl_TessLevelOuter[1] = 1.0;\n\tgl_TessLevelOuter[2] = 1.0;\n\tgl_TessLevelInner[0] = 1.0;\n}\n"
         ,0x116);
  local_340._8_8_ = uVar3;
  paVar7->_M_local_buf[uVar3] = '\0';
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_2f0._0_4_ = iVar6;
  specializeShader(&local_210,(string *)local_340,(ContextType *)local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != &local_330) {
    operator_delete((void *)local_340._0_8_,local_330._M_allocated_capacity + 1);
  }
  local_318._0_4_ = 3;
  local_318._8_8_ = local_308._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_318 + 8),local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_318._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_318 + 8));
  local_360._M_dataplus._M_p = (pointer)0x120;
  local_2f0._0_8_ = &local_2e0;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_2f0,(ulong)&local_360);
  _Var2._M_p = local_360._M_dataplus._M_p;
  local_2e0._M_allocated_capacity = (size_type)local_360._M_dataplus._M_p;
  local_2f0._0_8_ = paVar7;
  memcpy(paVar7,
         "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(triangles) in;\nout highp vec4 tf_feedback;\nvoid main()\n{\n\tgl_Position = gl_in[0].gl_Position * gl_TessCoord.x + gl_in[1].gl_Position * gl_TessCoord.y + gl_in[2].gl_Position * gl_TessCoord.z;\n\ttf_feedback = vec4(2.0, 2.0, 2.0, 2.0);\n}\n"
         ,0x120);
  local_2f0._8_8_ = _Var2._M_p;
  paVar7->_M_local_buf[(long)_Var2._M_p] = '\0';
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_360._M_dataplus._M_p._0_4_ = iVar6;
  specializeShader(&local_230,(string *)local_2f0,(ContextType *)&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
  }
  local_340._0_4_ = 4;
  local_340._8_8_ = local_330._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_340 + 8),local_230._M_dataplus._M_p,
             local_230._M_dataplus._M_p + local_230._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_340._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_340 + 8));
  paVar7 = &local_360.field_2;
  local_298 = (long *)0x16c;
  local_360._M_dataplus._M_p = (pointer)paVar7;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_360,(ulong)&local_298);
  plVar4 = local_298;
  local_360.field_2._M_allocated_capacity = (size_type)local_298;
  local_360._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout (triangles) in;\nlayout (triangle_strip, max_vertices=3) out;\nout highp vec4 tf_feedback;\nvoid main()\n{\n\tfor (int ndx = 0; ndx < 3; ++ndx)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4(float(ndx), float(ndx)*float(ndx), 0.0, 0.0);\n\t\ttf_feedback = vec4(3.0, 3.0, 3.0, 3.0);\n\t\tEmitVertex();\n\t}\n\tEndPrimitive();\n}\n"
         ,0x16c);
  local_360._M_string_length = (size_type)plVar4;
  __dest[(long)plVar4] = '\0';
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_298 = (long *)CONCAT44(local_298._4_4_,iVar6);
  specializeShader(&local_250,&local_360,(ContextType *)&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar7) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  local_2f0._0_4_ = 2;
  local_2f0._8_8_ = local_2e0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2f0 + 8),local_250._M_dataplus._M_p,
             local_250._M_dataplus._M_p + local_250._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_2f0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2f0 + 8));
  local_108 = 0x8c8c;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"tf_feedback","");
  local_360._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_298,local_290 + (long)local_298);
  this_00 = local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,&local_360);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_1b0);
  this->m_program = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar7) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if ((char *)local_2f0._8_8_ != local_2e0._M_local_buf + 8) {
    operator_delete((void *)local_2f0._8_8_,local_2e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_340._8_8_ != local_330._M_local_buf + 8) {
    operator_delete((void *)local_340._8_8_,local_330._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_318._8_8_ != local_308._M_local_buf + 8) {
    operator_delete((void *)local_318._8_8_,local_308._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2c8._8_8_ != local_2b8._M_local_buf + 8) {
    operator_delete((void *)local_2c8._8_8_,local_2b8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    return (int)this->m_program;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"could not build program","");
  tcu::TestError::TestError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FeedbackRecordVariableSelectionCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 &&
		(!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") ||
		 !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions");

	m_testCtx.getLog() << tcu::TestLog::Message << "Declaring multiple output variables with the same name in multiple shader stages. Capturing the value of the varying using transform feedback." << tcu::TestLog::EndMessage;

	// gen feedback buffer fit for 1 triangle (4 components)
	{
		static const tcu::Vec4 initialData[3] =
		{
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
		};

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating buffer for transform feedback. Allocating storage for one triangle. Filling with -1.0" << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_xfbBuf);
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfbBuf);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (int)(sizeof(tcu::Vec4[3])), initialData, GL_DYNAMIC_READ);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen xfb buf");
	}

	// gen shader
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
																	 << glu::VertexSource(getVertexSource())
																	 << glu::FragmentSource(getFragmentSource())
																	 << glu::TessellationControlSource(getTessellationControlSource())
																	 << glu::TessellationEvaluationSource(getTessellationEvaluationSource())
																	 << glu::GeometrySource(getGeometrySource())
																	 << glu::TransformFeedbackMode(GL_INTERLEAVED_ATTRIBS)
																	 << glu::TransformFeedbackVarying("tf_feedback"));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build program");
}